

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O3

void __thiscall ctemplate::TemplateCache::ClearCache(TemplateCache *this)

{
  int iVar1;
  __node_base _Var2;
  WriterMutexLock ml;
  TemplateMap tmp_cache;
  WriterMutexLock local_50;
  _Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_48;
  
  local_48._M_buckets = &local_48._M_single_bucket;
  local_48._M_bucket_count = 1;
  local_48._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_48._M_element_count = 0;
  local_48._M_rehash_policy._M_max_load_factor = 1.0;
  local_48._M_rehash_policy._M_next_resize = 0;
  local_48._M_single_bucket = (__node_base_ptr)0x0;
  local_50.mu_ = this->mutex_;
  if (((pthread_rwlock_t *)((long)local_50.mu_ + 0x38))->__size[0] == '\x01') {
    iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)local_50.mu_);
    if (iVar1 != 0) {
      abort();
    }
  }
  std::
  _Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::swap(&this->parsed_template_cache_->_M_h,&local_48);
  this->is_frozen_ = false;
  WriterMutexLock::~WriterMutexLock(&local_50);
  for (_Var2._M_nxt = local_48._M_before_begin._M_nxt; _Var2._M_nxt != (_Hash_node_base *)0x0;
      _Var2._M_nxt = (_Var2._M_nxt)->_M_nxt) {
    RefcountedTemplate::DecRefN((RefcountedTemplate *)_Var2._M_nxt[3]._M_nxt,1);
  }
  DoneWithGetTemplatePtrs(this);
  std::
  _Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_48);
  return;
}

Assistant:

void TemplateCache::ClearCache() {
  // NOTE: We allow a frozen cache to be cleared with this method, although
  // no other changes can be made to the cache.
  // We clear the cache by swapping it with an empty cache.  This lets
  // us delete the items in the cache at our leisure without needing
  // to hold mutex_.
  TemplateMap tmp_cache;
  {
    WriterMutexLock ml(mutex_);
    parsed_template_cache_->swap(tmp_cache);
    is_frozen_ = false;
  }
  for (TemplateMap::iterator it = tmp_cache.begin();
       it != tmp_cache.end();
       ++it) {
    it->second.refcounted_tpl->DecRef();
  }

  // Do a decref for all templates ever returned by GetTemplate().
  DoneWithGetTemplatePtrs();
}